

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_list_int(kvtree *hash,int *n,int **v)

{
  int iVar1;
  int *__base;
  kvtree_elem_struct *pkVar2;
  ulong uVar3;
  
  *n = 0;
  *v = (int *)0x0;
  iVar1 = 0;
  if ((hash != (kvtree *)0x0) && (pkVar2 = hash->lh_first, pkVar2 != (kvtree_elem_struct *)0x0)) {
    iVar1 = 0;
    do {
      iVar1 = iVar1 + 1;
      pkVar2 = (pkVar2->pointers).le_next;
    } while (pkVar2 != (kvtree_elem_struct *)0x0);
  }
  if (iVar1 != 0) {
    __base = (int *)kvtree_malloc((long)iVar1 << 2,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                                  ,0x2a0);
    uVar3 = 0;
    if (hash == (kvtree *)0x0) {
      pkVar2 = (kvtree_elem_struct *)0x0;
    }
    else {
      pkVar2 = hash->lh_first;
    }
    if (pkVar2 != (kvtree_elem_struct *)0x0) {
      uVar3 = 0;
      do {
        iVar1 = atoi(pkVar2->key);
        __base[uVar3] = iVar1;
        uVar3 = uVar3 + 1;
        pkVar2 = (pkVar2->pointers).le_next;
      } while (pkVar2 != (kvtree_elem_struct *)0x0);
    }
    qsort(__base,uVar3 & 0xffffffff,4,kvtree_cmp_fn_int_asc);
    *n = (int)uVar3;
    *v = __base;
  }
  return 0;
}

Assistant:

int kvtree_list_int(const kvtree* hash, int* n, int** v)
{
  /* assume there aren't any keys */
  *n = 0;
  *v = NULL;

  /* count the number of keys */
  int count = kvtree_size(hash);
  if (count == 0) {
    return KVTREE_SUCCESS;
  }

  /* now allocate array of ints to save keys */
  int* list = (int*) KVTREE_MALLOC(count * sizeof(int));

  /* record key values in array */
  count = 0;
  kvtree_elem* elem;
  for (elem = kvtree_elem_first(hash);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    int key = kvtree_elem_key_int(elem);
    list[count] = key;
    count++;
  }

  /* sort the keys */
  qsort(list, count, sizeof(int), &kvtree_cmp_fn_int_asc);

  *n = count;
  *v = list;

  return KVTREE_SUCCESS;
}